

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

void stb_reassign(void *new_context,void *ptr)

{
  long *plVar1;
  long lVar2;
  void **q;
  void **q_2;
  undefined8 *puVar3;
  stb__alloc *src;
  
  if (new_context == (void *)0x0) {
    src = &stb__alloc_global;
  }
  else if (((uint)*(long *)((long)new_context + -8) & 3) == 1) {
    src = (stb__alloc *)(*(long *)((long)new_context + -8) + -1);
  }
  else {
    src = (stb__alloc *)((long)new_context + -0x20);
  }
  plVar1 = *(long **)((long)ptr + -8);
  if (((ulong)plVar1 & 3) != 0) {
    if (((uint)plVar1 & 3) == 2) {
      lVar2 = *(long *)((long)ptr + -0x10);
      **(long **)((long)ptr + -0x20) = lVar2;
      if (lVar2 != 0) {
        puVar3 = (undefined8 *)(lVar2 + -0x20);
        if ((*(uint *)(lVar2 + -8) & 3) != 2) {
          puVar3 = (undefined8 *)(lVar2 + -8);
        }
        *puVar3 = ((stb__alloc *)((long)ptr + -0x20))->prevn;
      }
      stb__insert_alloc(src,(stb__alloc *)((long)ptr + -0x20));
      return;
    }
    __assert_fail("t == STB__alloc || t == STB__nochildren",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                  ,0xb87,"void stb_reassign(void *, void *)");
  }
  lVar2 = *(long *)((long)ptr + -0x10);
  *plVar1 = lVar2;
  if (lVar2 != 0) {
    puVar3 = (undefined8 *)(lVar2 + -0x20);
    if ((*(uint *)(lVar2 + -8) & 3) != 2) {
      puVar3 = (undefined8 *)(lVar2 + -8);
    }
    *puVar3 = *(undefined8 *)((long)ptr + -8);
  }
  stb__insert_nochild(src,(stb__nochildren *)((long)ptr + -0x10));
  return;
}

Assistant:

void stb_reassign(void *new_context, void *ptr)
{
   stb__alloc *src = stb__get_context(new_context);

   stb__alloc_type t = stb__identify(ptr);
   assert(t == STB__alloc || t == STB__nochildren);

   if (t == STB__alloc) {
      stb__alloc *s = (stb__alloc *) ptr - 1;

      // unlink from old
      *(s->prevn) = s->next;
      if (s->next)
         *stb__prevn(s->next) = s->prevn;

      stb__insert_alloc(src, s);
   } else {
      stb__nochildren *s = (stb__nochildren *) ptr - 1;

      // unlink from old
      *(s->prevn) = s->next;
      if (s->next)
         *stb__prevn(s->next) = s->prevn;

      stb__insert_nochild(src, s);
   }
}